

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

uint32_t FNV32a(void *key,int len,uint32_t seed)

{
  byte *pbVar1;
  uint uVar2;
  uint32_t h;
  ulong uVar3;
  
  uVar2 = seed ^ 0x811c9dc5;
  if (0 < len) {
    uVar3 = 0;
    do {
      pbVar1 = (byte *)((long)key + uVar3);
      uVar3 = uVar3 + 1;
      uVar2 = (*pbVar1 ^ uVar2) * 0x1000193;
    } while ((uint)len != uVar3);
  }
  return uVar2;
}

Assistant:

uint32_t
FNV32a(const void *key, int len, uint32_t seed)
{
  uint32_t h = seed;
  const uint8_t  *data = (const uint8_t *)key;

  h ^= UINT32_C(2166136261);
  for (int i = 0; i < len; i++) {
    h ^= data[i];
    h *= 16777619;
  }
  return h;
}